

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_ManComputeOutputRequired(Of_Man_t *p,int fCleanRefs)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Of_Obj_t *pOVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  Jf_Par_t *pJVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  pGVar3 = p->pGia;
  iVar1 = pGVar3->nObjs;
  if (0 < (long)iVar1) {
    pOVar4 = p->pObjs;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&pOVar4->Required + lVar10) = 1000000000;
      if (fCleanRefs != 0) {
        *(undefined4 *)((long)&pOVar4->nRefs + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x20;
    } while ((long)iVar1 << 5 != lVar10);
  }
  pVVar5 = pGVar3->vCos;
  lVar10 = (long)pVVar5->nSize;
  if (lVar10 < 1) {
    uVar9 = 0;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    do {
      iVar12 = pVVar5->pArray[lVar11];
      if (((long)iVar12 < 0) || (iVar1 <= iVar12)) goto LAB_0078698c;
      uVar2 = p->pObjs[(int)(iVar12 - (*(uint *)(pGVar3->pObjs + iVar12) & 0x1fffffff))].Delay1;
      if ((int)uVar2 < (int)uVar9) {
        uVar2 = uVar9;
      }
      uVar9 = uVar2;
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  if (0 < pVVar5->nSize) {
    piVar6 = pVVar5->pArray;
    lVar11 = 0;
    do {
      iVar12 = piVar6[lVar11];
      if (((long)iVar12 < 0) || (iVar1 <= iVar12)) {
LAB_0078698c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar12 = iVar12 - (*(uint *)(pGVar3->pObjs + iVar12) & 0x1fffffff);
      pOVar4 = p->pObjs;
      if ((int)uVar9 < pOVar4[iVar12].Required) {
        pOVar4[iVar12].Required = uVar9;
      }
      if (fCleanRefs != 0) {
        pOVar4[iVar12].nRefs = pOVar4[iVar12].nRefs + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  uVar7 = p->pPars->Delay;
  if ((uVar7 != 0) && (uVar7 < uVar9)) {
    puts("Error: Delay violation.");
  }
  pJVar8 = p->pPars;
  pJVar8->Delay = (ulong)uVar9;
  return (int)pJVar8;
}

Assistant:

static inline int Of_ManComputeOutputRequired( Of_Man_t * p, int fCleanRefs )
{
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Of_ObjSetRequired( p, i, ABC_INFINITY );
        if ( fCleanRefs )
            Of_ObjSetRefNum( p, i, 0 );
    }
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Of_ObjDelay1(p, Id) );
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
    {
        Of_ObjUpdateRequired( p, Id, Delay );
        if ( fCleanRefs )
            Of_ObjRefInc( p, Id );
    }
    if ( p->pPars->Delay && p->pPars->Delay < Delay )
        printf( "Error: Delay violation.\n" );
    p->pPars->Delay = Delay;
    return Delay;
}